

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O2

int arkGetNumGEvals(void *arkode_mem,long *ngevals)

{
  if (arkode_mem == (void *)0x0) {
    arkode_mem = (ARKodeMem)0x0;
  }
  else if (*(long *)((long)arkode_mem + 0x280) != 0) {
    *ngevals = *(long *)(*(long *)((long)arkode_mem + 0x280) + 0x68);
    return 0;
  }
  arkProcessError((ARKodeMem)arkode_mem,-0x15,"ARKode","arkGetNumGEvals",
                  "arkode_mem = NULL illegal.");
  return -0x15;
}

Assistant:

int arkGetNumGEvals(void *arkode_mem, long int *ngevals)
{
  ARKodeMem ark_mem;
  ARKodeRootMem ark_root_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkGetNumGEvals", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;
  if (ark_mem->root_mem == NULL) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode",
                    "arkGetNumGEvals", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_root_mem = (ARKodeRootMem) ark_mem->root_mem;
  *ngevals = ark_root_mem->nge;
  return(ARK_SUCCESS);
}